

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glob.cxx
# Opt level: O2

bool __thiscall
cmsys::Glob::RecurseDirectory(Glob *this,size_type start,string *dir,GlobMessages *messages)

{
  pointer pRVar1;
  bool bVar2;
  bool bVar3;
  unsigned_long uVar4;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  ulong dindex;
  bool bVar7;
  Directory d;
  string message;
  string realPathErrorMessage;
  string realname;
  string canonicalPath;
  string fname;
  Directory local_178;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_170;
  size_type local_168;
  size_type local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  string local_118;
  undefined1 local_f8 [40];
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_160 = start;
  Directory::Directory(&local_178);
  bVar2 = Directory::Load(&local_178,dir);
  bVar7 = true;
  if (bVar2) {
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    local_118._M_string_length = 0;
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    local_90._M_string_length = 0;
    dindex = 0;
    local_118.field_2._M_local_buf[0] = '\0';
    local_90.field_2._M_local_buf[0] = '\0';
    local_168 = local_160 + 1;
    local_170 = &this->VisitedSymlinks;
    while( true ) {
      uVar4 = Directory::GetNumberOfFiles(&local_178);
      bVar7 = uVar4 <= dindex;
      if (bVar7) break;
      Directory::GetFile(&local_178,dindex);
      std::__cxx11::string::assign((char *)&local_90);
      bVar2 = std::operator==(&local_90,".");
      if ((!bVar2) && (bVar2 = std::operator==(&local_90,".."), !bVar2)) {
        if (local_160 == 0) {
          pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8;
          std::operator+(pbVar6,dir,&local_90);
          std::__cxx11::string::operator=((string *)&local_118,(string *)pbVar6);
        }
        else {
          pbVar6 = &local_138;
          std::operator+(pbVar6,dir,"/");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_f8,pbVar6,&local_90);
          std::__cxx11::string::operator=((string *)&local_118,(string *)local_f8);
          std::__cxx11::string::~string((string *)local_f8);
        }
        std::__cxx11::string::~string((string *)pbVar6);
        bVar2 = SystemTools::FileIsDirectory(&local_118);
        bVar3 = SystemTools::FileIsSymlink(&local_118);
        if (bVar2) {
          if (bVar3) {
            if (this->RecurseThroughSymlinks != true) goto LAB_002fe93f;
            this->FollowedSymlinkCount = this->FollowedSymlinkCount + 1;
            local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
            local_138._M_string_length = 0;
            local_138.field_2._M_local_buf[0] = '\0';
            SystemTools::GetRealPath(&local_d0,dir,&local_138);
            if (local_138._M_string_length != 0) {
              if (messages != (GlobMessages *)0x0) {
                std::operator+(&local_70,"Canonical path generation from path \'",dir);
                std::operator+(&local_50,&local_70,"\' failed! Reason: \'");
                std::operator+(&local_b0,&local_50,&local_138);
                std::operator+(&local_158,&local_b0,"\'");
                local_f8._0_4_ = error;
                std::__cxx11::string::string((string *)(local_f8 + 8),(string *)&local_158);
                std::vector<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>::
                emplace_back<cmsys::Glob::Message>(messages,(Message *)local_f8);
                std::__cxx11::string::~string((string *)(local_f8 + 8));
                std::__cxx11::string::~string((string *)&local_158);
                std::__cxx11::string::~string((string *)&local_b0);
                std::__cxx11::string::~string((string *)&local_50);
                std::__cxx11::string::~string((string *)&local_70);
              }
LAB_002febc4:
              std::__cxx11::string::~string((string *)&local_d0);
              std::__cxx11::string::~string((string *)&local_138);
              break;
            }
            _Var5 = std::
                    __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                              ((this->VisitedSymlinks).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start,
                               (this->VisitedSymlinks).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish,&local_d0);
            pbVar6 = (this->VisitedSymlinks).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            if (_Var5._M_current == pbVar6) {
              if (this->RecurseListDirs == true) {
                AddFile(this,&this->Internals->Files,&local_118);
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(local_170,&local_d0);
              bVar2 = RecurseDirectory(this,local_168,&local_118,messages);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::pop_back(local_170);
              if (!bVar2) goto LAB_002febc4;
            }
            else if (messages != (GlobMessages *)0x0) {
              local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
              local_158._M_string_length = 0;
              local_158.field_2._M_local_buf[0] = '\0';
              for (_Var5 = std::
                           __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                                     ((local_170->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start,pbVar6,&local_d0);
                  _Var5._M_current !=
                  (this->VisitedSymlinks).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
                  _Var5._M_current = _Var5._M_current + 1) {
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_f8,_Var5._M_current,"\n");
                std::__cxx11::string::append((string *)&local_158);
                std::__cxx11::string::~string((string *)local_f8);
              }
              std::operator+(&local_b0,&local_d0,"/");
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_f8,&local_b0,&local_90);
              std::__cxx11::string::append((string *)&local_158);
              std::__cxx11::string::~string((string *)local_f8);
              std::__cxx11::string::~string((string *)&local_b0);
              local_f8._0_4_ = cyclicRecursion;
              std::__cxx11::string::string((string *)(local_f8 + 8),(string *)&local_158);
              std::vector<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>::
              emplace_back<cmsys::Glob::Message>(messages,(Message *)local_f8);
              std::__cxx11::string::~string((string *)(local_f8 + 8));
              std::__cxx11::string::~string((string *)&local_158);
            }
            std::__cxx11::string::~string((string *)&local_d0);
            std::__cxx11::string::~string((string *)&local_138);
          }
          else {
            if (this->RecurseListDirs == true) {
              AddFile(this,&this->Internals->Files,&local_118);
            }
            bVar2 = RecurseDirectory(this,local_168,&local_118,messages);
            if (!bVar2) break;
          }
        }
        else {
LAB_002fe93f:
          pRVar1 = (this->Internals->Expressions).
                   super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (((this->Internals->Expressions).
               super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
               ._M_impl.super__Vector_impl_data._M_start != pRVar1) &&
             (bVar2 = RegularExpression::find(pRVar1 + -1,local_90._M_dataplus._M_p), bVar2)) {
            AddFile(this,&this->Internals->Files,&local_118);
          }
        }
      }
      dindex = dindex + 1;
    }
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_118);
  }
  Directory::~Directory(&local_178);
  return bVar7;
}

Assistant:

bool Glob::RecurseDirectory(std::string::size_type start,
                            const std::string& dir, GlobMessages* messages)
{
  kwsys::Directory d;
  if (!d.Load(dir)) {
    return true;
  }
  unsigned long cc;
  std::string realname;
  std::string fname;
  for (cc = 0; cc < d.GetNumberOfFiles(); cc++) {
    fname = d.GetFile(cc);
    if (fname == "." || fname == "..") {
      continue;
    }

    if (start == 0) {
      realname = dir + fname;
    } else {
      realname = dir + "/" + fname;
    }

#if defined(KWSYS_GLOB_CASE_INDEPENDENT)
    // On Windows and Apple, no difference between lower and upper case
    fname = kwsys::SystemTools::LowerCase(fname);
#endif

    bool isDir = kwsys::SystemTools::FileIsDirectory(realname);
    bool isSymLink = kwsys::SystemTools::FileIsSymlink(realname);

    if (isDir && (!isSymLink || this->RecurseThroughSymlinks)) {
      if (isSymLink) {
        ++this->FollowedSymlinkCount;
        std::string realPathErrorMessage;
        std::string canonicalPath(
          SystemTools::GetRealPath(dir, &realPathErrorMessage));

        if (!realPathErrorMessage.empty()) {
          if (messages) {
            messages->push_back(
              Message(Glob::error,
                      "Canonical path generation from path '" + dir +
                        "' failed! Reason: '" + realPathErrorMessage + "'"));
          }
          return false;
        }

        if (std::find(this->VisitedSymlinks.begin(),
                      this->VisitedSymlinks.end(),
                      canonicalPath) == this->VisitedSymlinks.end()) {
          if (this->RecurseListDirs) {
            // symlinks are treated as directories
            this->AddFile(this->Internals->Files, realname);
          }

          this->VisitedSymlinks.push_back(canonicalPath);
          if (!this->RecurseDirectory(start + 1, realname, messages)) {
            this->VisitedSymlinks.pop_back();

            return false;
          }
          this->VisitedSymlinks.pop_back();
        }
        // else we have already visited this symlink - prevent cyclic recursion
        else if (messages) {
          std::string message;
          for (std::vector<std::string>::const_iterator pathIt =
                 std::find(this->VisitedSymlinks.begin(),
                           this->VisitedSymlinks.end(), canonicalPath);
               pathIt != this->VisitedSymlinks.end(); ++pathIt) {
            message += *pathIt + "\n";
          }
          message += canonicalPath + "/" + fname;
          messages->push_back(Message(Glob::cyclicRecursion, message));
        }
      } else {
        if (this->RecurseListDirs) {
          this->AddFile(this->Internals->Files, realname);
        }
        if (!this->RecurseDirectory(start + 1, realname, messages)) {
          return false;
        }
      }
    } else {
      if (!this->Internals->Expressions.empty() &&
          this->Internals->Expressions.back().find(fname)) {
        this->AddFile(this->Internals->Files, realname);
      }
    }
  }

  return true;
}